

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaBuildCommand.cpp
# Opt level: O3

void __thiscall
(anonymous_namespace)::buildCommand((anonymous_namespace)::BuildContext&,llbuild::ninja::Command*)::
NinjaCommandTask::inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict _Var2;
  ulong uVar3;
  ulong uVar4;
  undefined4 uVar5;
  bool bVar6;
  hash_code commandHash;
  FileInfo *pFVar7;
  code *pcVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  _Any_data *p_Var12;
  BuildContext *pBVar13;
  bool bVar14;
  StringRef S;
  type addExecuteJob;
  BuildValue result;
  ValueType local_d0;
  TaskInterface local_b8;
  undefined1 local_a8 [88];
  CommandSignature CStack_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  
  S.Length = (pointer)ti.ctx;
  local_b8.impl = ti.impl;
  local_b8.ctx = S.Length;
  if ((*(byte *)(*(long *)((long)this + 8) + 0xa8) & 1) == 0) {
    S.Data = *(char **)(*(long *)((long)this + 0x10) + 0x78);
    commandHash = llvm::hash_value(*(llvm **)(*(long *)((long)this + 0x10) + 0x70),S);
    pBVar13 = *(BuildContext **)((long)this + 8);
    if (*(Rule **)(*(long *)((long)this + 0x10) + 8) ==
        ((pBVar13->manifest)._M_t.
         super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
         ._M_t.
         super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
         .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->phonyRule) {
      computeCommandResult(llbuild::basic::CommandSignature__const
                ((BuildValue *)local_a8,this,(CommandSignature)commandHash.value);
      if ((local_a8._0_4_ & ~SuccessfulCommand) != ExistingInput) {
        __assert_fail("(isExistingInput() || isSuccessfulCommand()) && \"invalid call for value kind\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                      ,0x114,"unsigned int (anonymous namespace)::BuildValue::getNumOutputs() const"
                     );
      }
      if (local_a8._4_4_ == 0) {
        bVar6 = false;
      }
      else {
        uVar11 = local_a8._4_4_ - 1;
        uVar10 = 0;
        do {
          pFVar7 = anon_unknown.dwarf_b0fca::BuildValue::getNthOutputInfo
                             ((BuildValue *)local_a8,uVar10);
          bVar6 = llbuild::basic::FileInfo::isMissing(pFVar7);
          if (bVar6) break;
          bVar14 = uVar11 != uVar10;
          uVar10 = uVar10 + 1;
        } while (bVar14);
      }
      anon_unknown.dwarf_b0fca::BuildValue::toValue(&local_d0,(BuildValue *)local_a8);
LAB_0012b49b:
      llbuild::core::TaskInterface::complete(&local_b8,&local_d0,bVar6);
      if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((void *)CONCAT44(local_a8._12_4_,local_a8._8_4_) == (void *)0x0 ||
          (uint)local_a8._4_4_ < 2) {
        return;
      }
      operator_delete__((void *)CONCAT44(local_a8._12_4_,local_a8._8_4_));
      return;
    }
    if (*(char *)((long)this + 0x1a) == '\x01') {
      if (((*(byte *)(*(long *)((long)this + 0x10) + 0x110) & 4) != 0) ||
         ((*(char *)((long)this + 0x1b) == '\x01' &&
          (*(size_t *)((long)this + 0x20) == commandHash.value)))) {
        computeCommandResult(llbuild::basic::CommandSignature__const
                  ((BuildValue *)local_a8,this,(CommandSignature)commandHash.value);
        uVar5 = local_a8._4_4_;
        if (local_a8._0_4_ != SuccessfulCommand) {
          __assert_fail("result.isSuccessfulCommand()",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                        ,0x44a,
                        "bool (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::canUpdateIfNewerWithResult(const BuildValue &)"
                       );
        }
        if (local_a8._4_4_ == 0) {
          lVar9 = *(long *)((long)this + 8);
        }
        else {
          uVar10 = 0;
          do {
            pFVar7 = anon_unknown.dwarf_b0fca::BuildValue::getNthOutputInfo
                               ((BuildValue *)local_a8,uVar10);
            bVar6 = llbuild::basic::FileInfo::isMissing(pFVar7);
            if (bVar6) {
LAB_0012b4e0:
              if ((void *)CONCAT44(local_a8._12_4_,local_a8._8_4_) != (void *)0x0 &&
                  1 < (uint)local_a8._4_4_) {
                operator_delete__((void *)CONCAT44(local_a8._12_4_,local_a8._8_4_));
              }
              pBVar13 = *(BuildContext **)((long)this + 8);
              goto LAB_0012b500;
            }
            lVar9 = *(long *)((long)this + 8);
            uVar3 = *(ulong *)((long)this + 0x28);
            uVar4 = (pFVar7->modTime).seconds;
            if (*(char *)(lVar9 + 0x92) == '\x01') {
              if ((uVar4 < uVar3) ||
                 ((uVar4 == uVar3 &&
                  ((pFVar7->modTime).nanoseconds <= *(ulong *)((long)this + 0x30)))))
              goto LAB_0012b4e0;
            }
            else if ((uVar4 < uVar3) ||
                    ((uVar4 == uVar3 &&
                     ((pFVar7->modTime).nanoseconds < *(ulong *)((long)this + 0x30)))))
            goto LAB_0012b4e0;
            uVar10 = uVar10 + 1;
          } while (uVar5 != uVar10);
        }
        LOCK();
        *(int *)(lVar9 + 200) = *(int *)(lVar9 + 200) + 1;
        UNLOCK();
        anon_unknown.dwarf_b0fca::BuildValue::toValue(&local_d0,(BuildValue *)local_a8);
        bVar6 = false;
        goto LAB_0012b49b;
      }
      *(undefined1 *)((long)this + 0x1a) = 0;
    }
LAB_0012b500:
    pBVar13->numBuiltCommands = pBVar13->numBuiltCommands + 1;
    if (pBVar13->simulate == true) {
      if (pBVar13->quiet == false) {
        writeDescription((anonymous_namespace)::BuildContext&,llbuild::ninja::Command__
                  (pBVar13,*(Command **)((long)this + 0x10));
      }
    }
    else {
      if (*(char *)((long)this + 0x18) != '\x01') {
        if (*(char *)((long)this + 0x19) != '\0') {
          __assert_fail("!hasMissingInput",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp"
                        ,0x4ba,
                        "virtual void (anonymous namespace)::buildCommand(BuildContext &, ninja::Command *)::NinjaCommandTask::inputsAvailable(core::TaskInterface)"
                       );
        }
        local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_b8.impl;
        local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_b8.ctx;
        local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)this;
        if (*(Pool **)(*(long *)((long)this + 0x10) + 0x68) ==
            ((pBVar13->manifest)._M_t.
             super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
             ._M_t.
             super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
             .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl)->consolePool) {
          local_48._8_8_ = 0;
          local_48._M_unused._M_object = operator_new(0x18);
          *(pointer *)local_48._M_unused._0_8_ =
               local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)((long)local_48._M_unused._0_8_ + 8) =
               local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          *(pointer *)((long)local_48._M_unused._0_8_ + 0x10) =
               local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
          local_30 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1256:36)>
                     ::_M_invoke;
          local_38 = std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1256:36)>
                     ::_M_manager;
          llbuild::basic::SerialQueue::async(&pBVar13->consoleQueue,(function<void_()> *)&local_48);
          if (local_38 == (code *)0x0) {
            return;
          }
          p_Var12 = &local_48;
          pcVar8 = local_38;
        }
        else {
          local_a8._0_4_ = ExistingInput;
          local_a8._4_4_ = 0;
          local_a8._8_4_ = 0;
          local_a8._12_4_ = 0;
          local_a8._24_4_ = 0x12d0ec;
          local_a8._28_4_ = 0;
          local_a8._16_4_ = 0x12d0ee;
          local_a8._20_4_ = 0;
          std::
          remove_reference<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/NinjaBuildCommand.cpp:1212:28)_&>
          ::type::operator()(&local_d0,(function<void_()> *)local_a8);
          if ((code *)CONCAT44(local_a8._20_4_,local_a8._16_4_) == (code *)0x0) {
            return;
          }
          p_Var12 = (_Any_data *)local_a8;
          pcVar8 = (code *)CONCAT44(local_a8._20_4_,local_a8._16_4_);
        }
        (*pcVar8)(p_Var12,p_Var12,__destroy_functor);
        return;
      }
      if (*(char *)((long)this + 0x19) != '\0') {
        anon_unknown.dwarf_b0fca::BuildContext::emitError
                  (pBVar13,"cannot build \'%s\' due to missing input",
                   *(undefined8 *)(**(long **)(*(long *)((long)this + 0x10) + 0x10) + 0x20));
        pBVar13 = *(BuildContext **)((long)this + 8);
        LOCK();
        paVar1 = &pBVar13->numFailedCommands;
        _Var2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
        (paVar1->super___atomic_base<unsigned_int>)._M_i =
             (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
        if ((pBVar13->numFailedCommandsToTolerate != 0) &&
           (_Var2 + 1 == pBVar13->numFailedCommandsToTolerate)) {
          anon_unknown.dwarf_b0fca::BuildContext::emitError
                    (pBVar13,"stopping build due to command failures");
          LOCK();
          (pBVar13->isCancelled)._M_base._M_i = true;
          UNLOCK();
        }
      }
    }
  }
  local_a8._0_4_ = SkippedCommand;
  local_a8._4_4_ = 0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_4_ = 0;
  local_a8._20_4_ = 0;
  local_a8._24_4_ = 0;
  local_a8._28_4_ = 0;
  local_a8._32_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8._44_8_ = 0;
  local_a8._52_8_ = 0;
  local_a8._60_8_ = 0;
  local_a8._68_8_ = 0;
  local_a8._76_4_ = 0;
  local_a8._80_4_ = 0;
  local_a8._84_4_ = 0;
  CStack_50.value = 0;
  anon_unknown.dwarf_b0fca::BuildValue::toValue(&local_d0,(BuildValue *)local_a8);
  llbuild::core::TaskInterface::complete(&local_b8,&local_d0,false);
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual void inputsAvailable(core::TaskInterface ti) override {
      // If the build is cancelled, skip everything.
      if (context.isCancelled) {
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // Ignore phony commands.
      //
      // FIXME: Is it right to bring this up-to-date when one of the inputs
      // indicated a failure? It probably doesn't matter.
      auto commandHash = CommandSignature(command->getCommandString());
      if (command->getRule() == context.manifest->getPhonyRule()) {
        // Get the result.
        BuildValue result = computeCommandResult(commandHash);

        // If any output is missing, then we always want to force the change to
        // propagate.
        bool forceChange = false;
        for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
            if (result.getNthOutputInfo(i).isMissing()) {
                forceChange = true;
                break;
            }
        }

        return ti.complete(result.toValue(), forceChange);
      }

      // If it is legal to simply update the command, then if the command output
      // exists and is newer than all of the inputs, don't actually run the
      // command (just bring it up-to-date).
      if (canUpdateIfNewer) {
        // If this isn't a generator command and its command hash differs, we
        // can't update it.
        if (!command->hasGeneratorFlag() &&
            (!hasPriorResult || priorCommandHash != commandHash))
          canUpdateIfNewer = false;

        if (canUpdateIfNewer) {
          BuildValue result = computeCommandResult(commandHash);

          if (canUpdateIfNewerWithResult(result)) {
            // Update the count of the number of commands which have been
            // updated without being rerun.
            ++context.numCommandsUpdated;

            return ti.complete(result.toValue());
          }
        }
      }

      // Otherwise, actually run the command.

      ++context.numBuiltCommands;

      // If we are simulating the build, just print the description and
      // complete.
      if (context.simulate) {
        if (!context.quiet)
          writeDescription(context, command);
        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }

      // If not simulating, but this command should be skipped, then do nothing.
      if (shouldSkip) {
        // If this command had a failed input, treat it as having failed.
        if (hasMissingInput) {
          context.emitError("cannot build '%s' due to missing input",
                            command->getOutputs()[0]->getScreenPath().c_str());

          // Update the count of failed commands.
          context.incrementFailedCommands();
        }

        return ti.complete(BuildValue::makeSkippedCommand().toValue());
      }
      assert(!hasMissingInput);

      auto addExecuteJob = [this, ti](std::function<void(void)>&& jobFullyExecuted) mutable {
        // Otherwise, enqueue the job to run later.
        ti.spawn({command, [this, ti, done=std::move(jobFullyExecuted)] (QueueJobContext* qctx) mutable {
          // Suppress static analyzer false positive on generalized lambda capture
          // (rdar://problem/22165130).
#ifndef __clang_analyzer__
          // Take care to not rely on the ``this`` object, which may disappear
          // before the queue executes this block.
          BuildContext& localContext(context);
          ninja::Command* localCommand(command);
          auto bucket = qctx->laneID();

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t startTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"B\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(startTime));
              });
          }

          executeCommand(ti, qctx);

          if (localContext.profileFP) {
            localContext.consoleQueue.async(
              [&localContext=localContext, localCommand=localCommand, bucket] {
                uint64_t endTime = getTimeInMicroseconds();
                fprintf(localContext.profileFP,
                        ("{ \"name\": \"%s\", \"ph\": \"E\", \"pid\": 0, "
                         "\"tid\": %d, \"ts\": %llu},\n"),
                        localCommand->getEffectiveDescription().c_str(), bucket,
                        static_cast<unsigned long long>(endTime));
              });
          }
          done();
#endif
        }});
      };

      bool isConsolePool = command->getExecutionPool() == context.manifest->getConsolePool();
      if (isConsolePool) {
        context.consoleQueue.async([addExecuteJob=std::move(addExecuteJob)] () mutable {
          std::promise<void> p;
          auto result = p.get_future();
          addExecuteJob([&p]{ p.set_value(); });
          result.get();
        });
      } else {
        addExecuteJob([]{});
      }
    }